

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O3

ostream * __thiscall
dynamicgraph::Signal<double,_int>::display(Signal<double,_int> *this,ostream *os)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Sig:",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(this->super_SignalBase<int>).name._M_dataplus._M_p,
                      (this->super_SignalBase<int>).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (Type ",7);
  switch(this->signalType) {
  case CONSTANT:
    pcVar3 = "Cst";
    break;
  case REFERENCE:
    pcVar3 = "Ref";
    break;
  case REFERENCE_NON_CONST:
    pcVar3 = "RefNonCst";
    lVar2 = 9;
    goto LAB_00112cb2;
  case FUNCTION:
    pcVar3 = "Fun";
    break;
  default:
    goto switchD_00112c84_default;
  }
  lVar2 = 3;
LAB_00112cb2:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
switchD_00112c84_default:
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return os;
}

Assistant:

std::ostream &Signal<T, Time>::display(std::ostream &os) const {
  os << "Sig:" << this->name << " (Type ";
  switch (this->signalType) {
    case Signal<T, Time>::CONSTANT:
      os << "Cst";
      break;
    case Signal<T, Time>::REFERENCE:
      os << "Ref";
      break;
    case Signal<T, Time>::REFERENCE_NON_CONST:
      os << "RefNonCst";
      break;
    case Signal<T, Time>::FUNCTION:
      os << "Fun";
      break;
  }
  return os << ")";
}